

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSharedData::SetCircleTessellationMaxError(ImDrawListSharedData *this,float max_error)

{
  undefined1 auVar1 [16];
  ImU8 IVar2;
  uint uVar3;
  int i;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001284 [12];
  
  if ((this->CircleSegmentMaxError == max_error) &&
     (!NAN(this->CircleSegmentMaxError) && !NAN(max_error))) {
    return;
  }
  this->CircleSegmentMaxError = max_error;
  lVar4 = 0;
  do {
    if (lVar4 == 0) {
      IVar2 = '\0';
    }
    else {
      auVar6._0_4_ = (float)(int)lVar4;
      auVar6._4_12_ = in_register_00001284;
      auVar1 = vminss_avx(ZEXT416((uint)this->CircleSegmentMaxError),auVar6);
      fVar5 = acosf(1.0 - auVar1._0_4_ / auVar6._0_4_);
      auVar1 = vroundss_avx(ZEXT416((uint)(3.1415927 / fVar5)),ZEXT416((uint)(3.1415927 / fVar5)),10
                           );
      uVar3 = ((int)auVar1._0_4_ - ((int)auVar1._0_4_ + 1 >> 0x1f)) + 1U & 0xfffffffe;
      if (0x1ff < (int)uVar3) {
        uVar3 = 0x200;
      }
      IVar2 = (ImU8)uVar3;
      if ((int)uVar3 < 5) {
        IVar2 = '\x04';
      }
    }
    this->CircleSegmentCounts[lVar4] = IVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  return;
}

Assistant:

void ImDrawListSharedData::SetCircleTessellationMaxError(float max_error)
{
    if (CircleSegmentMaxError == max_error)
        return;
    CircleSegmentMaxError = max_error;
    for (int i = 0; i < IM_ARRAYSIZE(CircleSegmentCounts); i++)
    {
        const float radius = (float)i;
        CircleSegmentCounts[i] = (ImU8)((i > 0) ? IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC(radius, CircleSegmentMaxError) : 0);
    }
}